

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cm_util.c
# Opt level: O1

attr_list CMint_attr_copy_list(CManager cm,attr_list l,char *file,int line)

{
  FILE *__stream;
  int iVar1;
  __pid_t _Var2;
  attr_list p_Var3;
  pthread_t pVar4;
  timespec ts;
  timespec local_40;
  
  p_Var3 = (attr_list)attr_copy_list(l);
  iVar1 = CMtrace_val[8];
  if (cm->CMTrace_file == (FILE *)0x0) {
    iVar1 = CMtrace_init(cm,CMAttrVerbose);
  }
  if (iVar1 != 0) {
    if (CMtrace_PID != 0) {
      __stream = (FILE *)cm->CMTrace_file;
      _Var2 = getpid();
      pVar4 = pthread_self();
      fprintf(__stream,"P%lxT%lx - ",(long)_Var2,pVar4);
    }
    if (CMtrace_timing != 0) {
      clock_gettime(1,&local_40);
      fprintf((FILE *)cm->CMTrace_file,"%lld.%.9ld - ",local_40.tv_sec,local_40.tv_nsec);
    }
    fprintf((FILE *)cm->CMTrace_file,"Copy attr list %p at %s:%d, new list %p\n",l,file,
            (ulong)(uint)line,p_Var3);
  }
  fflush((FILE *)cm->CMTrace_file);
  return p_Var3;
}

Assistant:

extern attr_list 
CMint_attr_copy_list(CManager cm, attr_list l, char *file, int line)
{
    attr_list ret = attr_copy_list(l);
    (void)cm;
    CMtrace_out(cm, CMAttrVerbose, "Copy attr list %p at %s:%d, new list %p\n", 
		l, file, line, ret);
    return ret;
}